

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O2

int __thiscall cali::Attribute::properties(Attribute *this)

{
  Node *pNVar1;
  int iVar2;
  Variant local_18;
  
  while( true ) {
    pNVar1 = this->m_node;
    if (pNVar1 == (Node *)0x0) {
      return 0;
    }
    if (pNVar1->m_attribute == 10) break;
    this = (Attribute *)
           ((long)&(((pNVar1->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                   super_LockfreeIntrusiveTree<cali::Node>).m_me +
           (pNVar1->super_LockfreeIntrusiveTree<cali::Node>).m_node);
  }
  local_18.m_v.type_and_size = (pNVar1->m_data).m_v.type_and_size;
  local_18.m_v.value = (pNVar1->m_data).m_v.value;
  iVar2 = Variant::to_int(&local_18,(bool *)0x0);
  return iVar2;
}

Assistant:

int Attribute::properties() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == PROP_ATTR_ID)
            return node->data().to_int();

    return CALI_ATTR_DEFAULT;
}